

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint64_t helper_bfffo_mem_m68k(CPUM68KState_conflict *env,uint32_t addr,int32_t ofs,uint32_t len)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  bf_data bVar5;
  uintptr_t unaff_retaddr;
  
  bVar5 = bf_prep(addr,ofs,len);
  uVar1 = bf_load(env,bVar5.addr,bVar5.blen,unaff_retaddr);
  uVar2 = (uVar1 & (ulong)(-1L << (-(char)bVar5.len & 0x3fU)) >> ((byte)bVar5.bofs & 0x3f)) <<
          ((byte)bVar5.bofs & 0x3f);
  uVar4 = 0x1f;
  uVar3 = (uint)(uVar2 >> 0x20);
  if (uVar3 != 0) {
    for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = uVar4 ^ 0x1f;
  if (uVar2 >> 0x20 == 0) {
    uVar4 = bVar5.len;
  }
  return uVar2 | uVar4 + ofs;
}

Assistant:

uint64_t HELPER(bfffo_mem)(CPUM68KState *env, uint32_t addr,
                           int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);
#ifdef _MSC_VER
    uint64_t mask = 0xffffffffffffffffULL << (64 - d.len) >> d.bofs;
#else
    uint64_t mask = -1ull << (64 - d.len) >> d.bofs;
#endif
    uint64_t n = (data & mask) << d.bofs;
    uint32_t ffo = helper_bfffo_reg(n >> 32, ofs, d.len);

    /*
     * Return FFO in the low word and N in the high word.
     * Note that because of MASK and the shift, the low word
     * is already zero.
     */
    return n | ffo;
}